

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_packet.cpp
# Opt level: O0

void mpp_packet_set_pos(MppPacket packet,void *pos)

{
  MPP_RET MVar1;
  ulong uVar2;
  size_t diff;
  size_t offset;
  MppPacketImpl *p;
  void *pos_local;
  MppPacket packet_local;
  
  MVar1 = check_is_mpp_packet_f(packet,"mpp_packet_set_pos");
  if (MVar1 == MPP_OK) {
    uVar2 = (long)pos - *(long *)((long)packet + 0x10);
    if (*(ulong *)((long)packet + 0x20) < uVar2) {
      *(long *)((long)packet + 0x20) =
           *(long *)((long)packet + 0x18) - ((long)pos - *(long *)((long)packet + 8));
    }
    else {
      *(ulong *)((long)packet + 0x20) = *(long *)((long)packet + 0x20) - uVar2;
    }
    *(void **)((long)packet + 0x10) = pos;
    if ((*(ulong *)((long)packet + 0x10) < *(ulong *)((long)packet + 8)) &&
       (_mpp_log_l(2,"mpp_packet","Assertion %s failed at %s:%d\n",(char *)0x0,"p->data <= p->pos",
                   "mpp_packet_set_pos",0xd1), (mpp_debug & 0x10000000) != 0)) {
      abort();
    }
    if ((*(ulong *)((long)packet + 0x18) < *(ulong *)((long)packet + 0x20)) &&
       (_mpp_log_l(2,"mpp_packet","Assertion %s failed at %s:%d\n",(char *)0x0,
                   "p->size >= p->length","mpp_packet_set_pos",0xd2), (mpp_debug & 0x10000000) != 0)
       ) {
      abort();
    }
  }
  return;
}

Assistant:

void mpp_packet_set_pos(MppPacket packet, void *pos)
{
    if (check_is_mpp_packet(packet))
        return ;

    MppPacketImpl *p = (MppPacketImpl *)packet;
    size_t offset = (RK_U8 *)pos - (RK_U8 *)p->data;
    size_t diff = (RK_U8 *)pos - (RK_U8 *)p->pos;

    /*
     * If set pos is a simple update on original buffer update the length
     * If set pos setup a new buffer reset length to size - offset
     * This will avoid assert on change "data" in mpp_packet
     */
    if (diff <= p->length)
        p->length -= diff;
    else
        p->length = p->size - offset;

    p->pos = pos;
    mpp_assert(p->data <= p->pos);
    mpp_assert(p->size >= p->length);
}